

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_204d176::XdgDesktopPortalColorPicker::pickColor
          (XdgDesktopPortalColorPicker *this)

{
  QDBusMessage *this_00;
  QDBusPendingCallWatcher *this_01;
  undefined4 *puVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  uint in_stack_ffffffffffffff2c;
  Connection local_b8 [8];
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QDBusMessage message;
  QDBusPendingCall pendingCall;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _message = &DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data = "org.freedesktop.portal.Desktop";
  latin1.m_size = 0x1e;
  QString::QString((QString *)&local_58,latin1);
  latin1_00.m_data = "/org/freedesktop/portal/desktop";
  latin1_00.m_size = 0x1f;
  QString::QString((QString *)&pendingCall,latin1_00);
  latin1_01.m_data = "org.freedesktop.portal.Screenshot";
  latin1_01.m_size = 0x21;
  QString::QString((QString *)&local_98,latin1_01);
  latin1_02.m_data = "PickColor";
  latin1_02.m_size = 9;
  QString::QString((QString *)&local_b0,latin1_02);
  QDBusMessage::createMethodCall
            ((QString *)&message,(QString *)&local_58,(QString *)&pendingCall,(QString *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pendingCall);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  ::QVariant::QVariant(&local_58,(QString *)&this->m_parentWindowId);
  this_00 = (QDBusMessage *)QDBusMessage::operator<<(&message,&local_58);
  local_98.d = (Data *)0x0;
  ::QVariant::QVariant((QVariant *)&pendingCall,(QMap *)&local_98);
  QDBusMessage::operator<<(this_00,(QVariant *)&pendingCall);
  ::QVariant::~QVariant((QVariant *)&pendingCall);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)&local_98);
  ::QVariant::~QVariant(&local_58);
  _pendingCall = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  QDBusConnection::asyncCall((QDBusMessage *)&pendingCall,(int)(QDBusConnection *)&local_58);
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_58);
  this_01 = (QDBusPendingCallWatcher *)operator_new(0x18);
  QDBusPendingCallWatcher::QDBusPendingCallWatcher(this_01,&pendingCall,(QObject *)this);
  local_58.d.data.shared = (PrivateShared *)QDBusPendingCallWatcher::finished;
  local_58.d.data._8_8_ = (char16_t *)0x0;
  puVar1 = (undefined4 *)operator_new(0x18);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:338:17),_QtPrivate::List<QDBusPendingCallWatcher_*>,_void>
       ::impl;
  *(XdgDesktopPortalColorPicker **)(puVar1 + 4) = this;
  QObject::connectImpl
            ((QObject *)local_b8,(void **)this_01,(QObject *)&local_58,(void **)this,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar1,
             (int *)((ulong)in_stack_ffffffffffffff2c << 0x20),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(local_b8);
  QDBusPendingCall::~QDBusPendingCall(&pendingCall);
  QDBusMessage::~QDBusMessage(&message);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pickColor() override
    {
        // DBus signature:
        // PickColor (IN   s      parent_window,
        //            IN   a{sv}  options
        //            OUT  o      handle)
        // Options:
        // handle_token (s) -  A string that will be used as the last element of the @handle.

        QDBusMessage message = QDBusMessage::createMethodCall(
                "org.freedesktop.portal.Desktop"_L1, "/org/freedesktop/portal/desktop"_L1,
                "org.freedesktop.portal.Screenshot"_L1, "PickColor"_L1);
        message << m_parentWindowId << QVariantMap();

        QDBusPendingCall pendingCall = QDBusConnection::sessionBus().asyncCall(message);
        auto watcher = new QDBusPendingCallWatcher(pendingCall, this);
        connect(watcher, &QDBusPendingCallWatcher::finished, this,
                [this](QDBusPendingCallWatcher *watcher) {
                    watcher->deleteLater();
                    QDBusPendingReply<QDBusObjectPath> reply = *watcher;
                    if (reply.isError()) {
                        qWarning("DBus call to pick color failed: %s",
                                 qPrintable(reply.error().message()));
                        Q_EMIT colorPicked({});
                    } else {
                        QDBusConnection::sessionBus().connect(
                                "org.freedesktop.portal.Desktop"_L1, reply.value().path(),
                                "org.freedesktop.portal.Request"_L1, "Response"_L1, this,
                                // clang-format off
                                SLOT(gotColorResponse(uint,QVariantMap))
                                // clang-format on
                        );
                    }
                });
    }